

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q.cpp
# Opt level: O2

void __thiscall Q::cleanup(Q *this,EVP_PKEY_CTX *ctx)

{
  pointer in;
  File item;
  Datetime now;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  File local_b0;
  Datetime local_58;
  
  Datetime::Datetime(&local_58);
  Datetime::operator-=(&local_58,0x278d00);
  Datetime::toEpoch(&local_58);
  archive_abi_cxx11_(&local_c8,this);
  for (in = local_c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      in != local_c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; in = in + 1) {
    File::File(&local_b0,in);
    File::mtime(&local_b0);
    File::~File(&local_b0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

int Q::cleanup () const
{
  // Count the removals.
  int count = 0;

  // Calculate epoch 30 days ago.
  Datetime now;
  now -= 30 * 86400;
  auto one_month_ago = now.toEpoch ();

  for (const auto& entry : archive ())
  {
    File item (entry);
    if (item.mtime () < one_month_ago)
    {
      //item.remove ();
      ++count;
    }
  }

  return count;
}